

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauNpn2.c
# Opt level: O2

void Dtt_PrintMulti2(Dtt_Man_t *p)

{
  uint uVar1;
  long lVar2;
  
  for (uVar1 = 0; uVar1 != 8; uVar1 = uVar1 + 1) {
    printf("n=%d : ",(ulong)uVar1);
    for (lVar2 = 0; lVar2 < p->nClasses; lVar2 = lVar2 + 1) {
      if (p->pNodes[lVar2] == uVar1) {
        printf("%d ",(ulong)(uint)p->pTimes[lVar2]);
      }
    }
    putchar(10);
  }
  return;
}

Assistant:

void Dtt_PrintMulti2( Dtt_Man_t * p )
{
    int i, n;
    for ( n = 0; n <= 7; n++ )
    {
        printf( "n=%d : ", n);
        for ( i = 0; i < p->nClasses; i++ )
            if ( p->pNodes[i] == n )
                printf( "%d ", p->pTimes[i] );
        printf( "\n" );
    }
}